

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_definitions.c
# Opt level: O1

int sasl_mechanisms_set_sasl_server_mechanisms
              (SASL_MECHANISMS_HANDLE sasl_mechanisms,AMQP_VALUE sasl_server_mechanisms_value)

{
  int iVar1;
  AMQP_VALUE item_value;
  int iVar2;
  
  if (sasl_mechanisms == (SASL_MECHANISMS_HANDLE)0x0) {
    iVar2 = 0x28b7;
  }
  else {
    if (sasl_server_mechanisms_value == (AMQP_VALUE)0x0) {
      item_value = (AMQP_VALUE)0x0;
    }
    else {
      item_value = amqpvalue_clone(sasl_server_mechanisms_value);
    }
    if (item_value == (AMQP_VALUE)0x0) {
      iVar2 = 0x28c7;
    }
    else {
      iVar1 = amqpvalue_set_composite_item(sasl_mechanisms->composite_value,0,item_value);
      iVar2 = 0x28cd;
      if (iVar1 == 0) {
        iVar2 = 0;
      }
      amqpvalue_destroy(item_value);
    }
  }
  return iVar2;
}

Assistant:

int sasl_mechanisms_set_sasl_server_mechanisms(SASL_MECHANISMS_HANDLE sasl_mechanisms, AMQP_VALUE sasl_server_mechanisms_value)
{
    int result;

    if (sasl_mechanisms == NULL)
    {
        result = MU_FAILURE;
    }
    else
    {
        SASL_MECHANISMS_INSTANCE* sasl_mechanisms_instance = (SASL_MECHANISMS_INSTANCE*)sasl_mechanisms;
        AMQP_VALUE sasl_server_mechanisms_amqp_value;
        if (sasl_server_mechanisms_value == NULL)
        {
            sasl_server_mechanisms_amqp_value = NULL;
        }
        else
        {
            sasl_server_mechanisms_amqp_value = amqpvalue_clone(sasl_server_mechanisms_value);
        }
        if (sasl_server_mechanisms_amqp_value == NULL)
        {
            result = MU_FAILURE;
        }
        else
        {
            if (amqpvalue_set_composite_item(sasl_mechanisms_instance->composite_value, 0, sasl_server_mechanisms_amqp_value) != 0)
            {
                result = MU_FAILURE;
            }
            else
            {
                result = 0;
            }

            amqpvalue_destroy(sasl_server_mechanisms_amqp_value);
        }
    }

    return result;
}